

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzerSettings.cpp
# Opt level: O1

void __thiscall JtagAnalyzerSettings::JtagAnalyzerSettings(JtagAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel *this_00;
  AnalyzerSettingInterfaceChannel *this_01;
  AnalyzerSettingInterfaceChannel *this_02;
  AnalyzerSettingInterfaceChannel *this_03;
  AnalyzerSettingInterfaceChannel *this_04;
  AnalyzerSettingInterfaceNumberList *this_05;
  AnalyzerSettingInterfaceNumberList *this_06;
  AnalyzerSettingInterfaceNumberList *this_07;
  AnalyzerSettingInterfaceInteger *this_08;
  AnalyzerSettingInterfaceBool *this_09;
  char *pcVar1;
  JtagTAPState mCurrTAPState;
  int iVar2;
  uint uVar3;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__JtagAnalyzerSettings_00110d58;
  Channel::Channel(&this->mTmsChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::Channel(&this->mTckChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::Channel(&this->mTdiChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::Channel(&this->mTdoChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::Channel(&this->mTrstChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mTAPInitialState = RunTestIdle;
  this->mInstructRegBitOrder = LSB_First;
  this->mDataRegBitOrder = LSB_First;
  this->mShowBitCount = false;
  this->mShiftDRBitsPerDataUnit = 0;
  this_00 = &this->mTmsChannelInterface;
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_00);
  this_01 = &this->mTckChannelInterface;
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_01);
  this_02 = &this->mTdiChannelInterface;
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_02);
  this_03 = &this->mTdoChannelInterface;
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_03);
  this_04 = &this->mTrstChannelInterface;
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_04);
  this_05 = &this->mTAPInitialStateInterface;
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(this_05);
  this_06 = &this->mInstructRegBitOrderInterface;
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(this_06);
  this_07 = &this->mDataRegBitOrderInterface;
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(this_07);
  this_08 = &this->mShiftDRDataUnitInterface;
  AnalyzerSettingInterfaceInteger::AnalyzerSettingInterfaceInteger(this_08);
  this_09 = &this->mShowBitCountInterface;
  AnalyzerSettingInterfaceBool::AnalyzerSettingInterfaceBool(this_09);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_00,"TMS");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_00);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_01,"TCK");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_01);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_02,"TDI");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_02);
  AnalyzerSettingInterfaceChannel::SetSelectionOfNoneIsAllowed(SUB81(this_02,0));
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_03,"TDO");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_03);
  AnalyzerSettingInterfaceChannel::SetSelectionOfNoneIsAllowed(SUB81(this_03,0));
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_04,"TRST");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_04);
  AnalyzerSettingInterfaceChannel::SetSelectionOfNoneIsAllowed(SUB81(this_04,0));
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_05,"TAP initial state");
  mCurrTAPState = TestLogicReset;
  do {
    pcVar1 = JtagAnalyzerResults::GetStateDescLong(mCurrTAPState);
    JtagAnalyzerResults::GetStateDescLong(mCurrTAPState);
    AnalyzerSettingInterfaceNumberList::AddNumber((double)(int)mCurrTAPState,(char *)this_05,pcVar1)
    ;
    mCurrTAPState = mCurrTAPState + RunTestIdle;
  } while (mCurrTAPState != 0x10);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mTAPInitialState);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_06,"Shift-IR bit order");
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)this_06,"Most significant bit first");
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)this_06,"Least significant bit first");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mInstructRegBitOrder);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_07,"Shift-DR bit order");
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)this_07,"Most significant bit first");
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)this_07,"Least significant bit first");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mDataRegBitOrder);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_08,"Shift-DR data unit");
  iVar2 = (int)this_08;
  AnalyzerSettingInterfaceInteger::SetInteger(iVar2);
  AnalyzerSettingInterfaceInteger::SetMin(iVar2);
  AnalyzerSettingInterfaceInteger::SetMax(iVar2);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_09,"");
  AnalyzerSettingInterfaceBool::SetCheckBoxText((char *)this_09);
  AnalyzerSettingInterfaceBool::SetValue(SUB81(this_09,0));
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar3 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar3,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar3,(char *)0x0,"csv");
  AnalyzerSettings::AddExportExtension(uVar3,(char *)0x0,"text");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mTmsChannel,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mTckChannel,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mTdiChannel,false);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mTdoChannel,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mTrstChannel,true);
  return;
}

Assistant:

JtagAnalyzerSettings::JtagAnalyzerSettings()
    : mTmsChannel( UNDEFINED_CHANNEL ),
      mTckChannel( UNDEFINED_CHANNEL ),
      mTdiChannel( UNDEFINED_CHANNEL ),
      mTdoChannel( UNDEFINED_CHANNEL ),
      mTrstChannel( UNDEFINED_CHANNEL ),
      mTAPInitialState( RunTestIdle ),
      mInstructRegBitOrder( LSB_First ),
      mDataRegBitOrder( LSB_First ),
      mShowBitCount( false ),
      mShiftDRBitsPerDataUnit( 0 )
{
    // init the interfaces
    mTmsChannelInterface.SetTitleAndTooltip( "TMS", "JTAG Test mode select" );
    mTmsChannelInterface.SetChannel( mTmsChannel );

    mTckChannelInterface.SetTitleAndTooltip( "TCK", "JTAG Test clock" );
    mTckChannelInterface.SetChannel( mTckChannel );

    mTdiChannelInterface.SetTitleAndTooltip( "TDI", "JTAG Test data input" );
    mTdiChannelInterface.SetChannel( mTdiChannel );
    mTdiChannelInterface.SetSelectionOfNoneIsAllowed( true );

    mTdoChannelInterface.SetTitleAndTooltip( "TDO", "JTAG Test data output" );
    mTdoChannelInterface.SetChannel( mTdoChannel );
    mTdoChannelInterface.SetSelectionOfNoneIsAllowed( true );

    mTrstChannelInterface.SetTitleAndTooltip( "TRST", "JTAG Test reset" );
    mTrstChannelInterface.SetChannel( mTrstChannel );
    mTrstChannelInterface.SetSelectionOfNoneIsAllowed( true );

    mTAPInitialStateInterface.SetTitleAndTooltip( "TAP initial state", "JTAG TAP controller initial state" );
    int state_cnt;
    for( state_cnt = 0; state_cnt < NUM_TAP_STATES; ++state_cnt )
        mTAPInitialStateInterface.AddNumber( state_cnt, JtagAnalyzerResults::GetStateDescLong( JtagTAPState( state_cnt ) ),
                                             JtagAnalyzerResults::GetStateDescLong( JtagTAPState( state_cnt ) ) );

    mTAPInitialStateInterface.SetNumber( mTAPInitialState );

    mInstructRegBitOrderInterface.SetTitleAndTooltip( "Shift-IR bit order", "Instruction register shift bit order" );
    mInstructRegBitOrderInterface.AddNumber( MSB_First, "Most significant bit first",
                                             "Instruction register shift MOST significant bit first" );
    mInstructRegBitOrderInterface.AddNumber( LSB_First, "Least significant bit first",
                                             "Instruction register shift LEAST significant bit first" );
    mInstructRegBitOrderInterface.SetNumber( mInstructRegBitOrder );

    mDataRegBitOrderInterface.SetTitleAndTooltip( "Shift-DR bit order", "Data register shift bit order" );
    mDataRegBitOrderInterface.AddNumber( MSB_First, "Most significant bit first", "Data register shift MOST significant bit first" );
    mDataRegBitOrderInterface.AddNumber( LSB_First, "Least significant bit first", "Data register shift LEAST significant bit first" );
    mDataRegBitOrderInterface.SetNumber( mDataRegBitOrder );

    mShiftDRDataUnitInterface.SetTitleAndTooltip( "Shift-DR data unit", "Number of bits to report as a single data unit. 0 to only report when TAP state changes." );
    mShiftDRDataUnitInterface.SetInteger( mShiftDRBitsPerDataUnit );
    mShiftDRDataUnitInterface.SetMin( 0 );
    mShiftDRDataUnitInterface.SetMax( 65536 );

    mShowBitCountInterface.SetTitleAndTooltip( "", "Used to count bits sent during Shift state" );
    mShowBitCountInterface.SetCheckBoxText( "Show TDI/TDO bit counts" );
    mShowBitCountInterface.SetValue( mShowBitCount );

    // add the interfaces
    AddInterface( &mTmsChannelInterface );
    AddInterface( &mTckChannelInterface );
    AddInterface( &mTdiChannelInterface );
    AddInterface( &mTdoChannelInterface );
    AddInterface( &mTrstChannelInterface );

    AddInterface( &mTAPInitialStateInterface );
    AddInterface( &mInstructRegBitOrderInterface );
    AddInterface( &mDataRegBitOrderInterface );
    AddInterface( &mShiftDRDataUnitInterface );

    AddInterface( &mShowBitCountInterface );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "csv", "csv" );
    AddExportExtension( 0, "text", "txt" );

    ClearChannels();

    AddChannel( mTmsChannel, "TMS", false );
    AddChannel( mTckChannel, "TCK", false );
    AddChannel( mTdiChannel, "TDI", false );
    AddChannel( mTdoChannel, "TDO", false );
    AddChannel( mTrstChannel, "TRST", false );
}